

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

bool computeDualObjectiveValue(HighsLp *lp,HighsSolution *solution,double *dual_objective_value)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  uint uVar15;
  double *pdVar16;
  double *pdVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  
  *dual_objective_value = 0.0;
  bVar3 = solution->dual_valid;
  if (bVar3 == true) {
    dVar21 = lp->offset_;
    *dual_objective_value = dVar21;
    iVar4 = lp->num_col_;
    lVar10 = (long)iVar4;
    uVar15 = lp->num_row_ + iVar4;
    if (uVar15 != 0 && SCARRY4(lp->num_row_,iVar4) == (int)uVar15 < 0) {
      pdVar5 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar13 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar10;
      pdVar14 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar10;
      pdVar11 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar10;
      pdVar9 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + -lVar10;
      uVar18 = 0;
      do {
        pdVar12 = pdVar13;
        pdVar16 = pdVar11;
        pdVar17 = pdVar9;
        pdVar19 = pdVar14;
        if ((long)uVar18 < lVar10) {
          pdVar12 = pdVar5 + uVar18;
          pdVar19 = pdVar6 + uVar18;
          pdVar16 = pdVar7 + uVar18;
          pdVar17 = pdVar8 + uVar18;
        }
        dVar1 = *pdVar16;
        dVar2 = *pdVar17;
        if ((-INFINITY < dVar1) || (dVar22 = 1.0, dVar2 < INFINITY)) {
          uVar20 = -(ulong)(*pdVar12 < (dVar1 + dVar2) * 0.5);
          dVar22 = (double)(~uVar20 & (ulong)dVar2 | (ulong)dVar1 & uVar20);
        }
        dVar21 = dVar21 + dVar22 * *pdVar19;
        *dual_objective_value = dVar21;
        uVar18 = uVar18 + 1;
        pdVar13 = pdVar13 + 1;
        pdVar14 = pdVar14 + 1;
        pdVar11 = pdVar11 + 1;
        pdVar9 = pdVar9 + 1;
      } while (uVar15 != uVar18);
    }
  }
  return bVar3;
}

Assistant:

bool computeDualObjectiveValue(const HighsLp& lp, const HighsSolution& solution,
                               double& dual_objective_value) {
  dual_objective_value = 0;
  if (!solution.dual_valid) return false;
  // #2184 Make sure that the solution corresponds to this LP
  assert(solution.col_value.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.col_dual.size() == static_cast<size_t>(lp.num_col_));
  assert(solution.row_value.size() == static_cast<size_t>(lp.num_row_));
  assert(solution.row_dual.size() == static_cast<size_t>(lp.num_row_));

  dual_objective_value = lp.offset_;
  double bound = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      bound = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      bound = primal < mid ? lower : upper;
    }
    dual_objective_value += bound * dual;
  }
  return true;
}